

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O3

vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_> *
__thiscall Assimp::FBX::Document::AnimationStacks(Document *this)

{
  _Rb_tree_header *p_Var1;
  vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  *this_00;
  pointer *pppAVar2;
  pointer puVar3;
  pointer puVar4;
  ulong *puVar5;
  ulong uVar6;
  iterator __position;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong *puVar9;
  AnimationStack *stack;
  AnimationStack *local_58;
  string local_50;
  
  this_00 = &this->animationStacksResolved;
  if ((this->animationStacksResolved).
      super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->animationStacksResolved).
      super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    puVar3 = (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->animationStacks).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar3 != puVar4) {
      std::
      vector<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
      ::reserve(this_00,(long)puVar4 - (long)puVar3 >> 3);
      puVar9 = (this->animationStacks).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (this->animationStacks).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (puVar9 != puVar5) {
        p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
        do {
          p_Var8 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var8 == (_Base_ptr)0x0) {
LAB_005c597c:
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"failed to read AnimationStack object","");
            Util::DOMWarning(&local_50,(Element *)0x0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            uVar6 = *puVar9;
            p_Var7 = &p_Var1->_M_header;
            do {
              if (*(ulong *)(p_Var8 + 1) >= uVar6) {
                p_Var7 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar6];
            } while (p_Var8 != (_Base_ptr)0x0);
            if (((((_Rb_tree_header *)p_Var7 == p_Var1) ||
                 (uVar6 < ((_Rb_tree_header *)p_Var7)->_M_node_count)) ||
                (*(LazyObject **)((long)p_Var7 + 0x28) == (LazyObject *)0x0)) ||
               (local_58 = LazyObject::Get<Assimp::FBX::AnimationStack>
                                     (*(LazyObject **)((long)p_Var7 + 0x28),false),
               local_58 == (AnimationStack *)0x0)) goto LAB_005c597c;
            __position._M_current =
                 (this->animationStacksResolved).
                 super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (this->animationStacksResolved).
                super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<Assimp::FBX::AnimationStack_const*,std::allocator<Assimp::FBX::AnimationStack_const*>>
              ::_M_realloc_insert<Assimp::FBX::AnimationStack_const*const&>
                        ((vector<Assimp::FBX::AnimationStack_const*,std::allocator<Assimp::FBX::AnimationStack_const*>>
                          *)this_00,__position,&local_58);
            }
            else {
              *__position._M_current = local_58;
              pppAVar2 = &(this->animationStacksResolved).
                          super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppAVar2 = *pppAVar2 + 1;
            }
          }
          puVar9 = puVar9 + 1;
        } while (puVar9 != puVar5);
      }
    }
  }
  return this_00;
}

Assistant:

const std::vector<const AnimationStack*>& Document::AnimationStacks() const
{
    if (!animationStacksResolved.empty() || animationStacks.empty()) {
        return animationStacksResolved;
    }

    animationStacksResolved.reserve(animationStacks.size());
    for(uint64_t id : animationStacks) {
        LazyObject* const lazy = GetObject(id);
        const AnimationStack* stack;
        if(!lazy || !(stack = lazy->Get<AnimationStack>())) {
            DOMWarning("failed to read AnimationStack object");
            continue;
        }
        animationStacksResolved.push_back(stack);
    }

    return animationStacksResolved;
}